

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

int __thiscall re2::Regexp::Walker<int>::Walk(Walker<int> *this,Regexp *re,int top_arg)

{
  int iVar1;
  int top_arg_local;
  Regexp *re_local;
  Walker<int> *this_local;
  
  this->max_visits_ = 1000000;
  iVar1 = WalkInternal(this,re,top_arg,true);
  return iVar1;
}

Assistant:

T Regexp::Walker<T>::Walk(Regexp* re, T top_arg) {
  // Without the exponential walking behavior,
  // this budget should be more than enough for any
  // regexp, and yet not enough to get us in trouble
  // as far as CPU time.
  max_visits_ = 1000000;
  return WalkInternal(re, top_arg, true);
}